

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_loader.cpp
# Opt level: O0

XrResult xrPollEvent(XrInstance instance,XrEventDataBuffer *eventData)

{
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_> *this
  ;
  pointer pXVar1;
  exception *e;
  XrResult local_2c;
  LoaderInstance *pLStack_28;
  XrResult result;
  LoaderInstance *loader_instance;
  XrEventDataBuffer *eventData_local;
  XrInstance instance_local;
  
  loader_instance = (LoaderInstance *)eventData;
  eventData_local = (XrEventDataBuffer *)instance;
  local_2c = ActiveLoaderInstance::Get(&stack0xffffffffffffffd8,"xrPollEvent");
  if (XR_ERROR_VALIDATION_FAILURE < local_2c) {
    this = LoaderInstance::DispatchTable(pLStack_28);
    pXVar1 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::operator->(this);
    local_2c = (*pXVar1->PollEvent)
                         ((XrInstance)eventData_local,(XrEventDataBuffer *)loader_instance);
  }
  return local_2c;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL xrPollEvent(
    XrInstance                                  instance,
    XrEventDataBuffer*                          eventData) XRLOADER_ABI_TRY {
    LoaderInstance* loader_instance;
    XrResult result = ActiveLoaderInstance::Get(&loader_instance, "xrPollEvent");
    if (XR_SUCCEEDED(result)) {
        result = loader_instance->DispatchTable()->PollEvent(instance, eventData);
    }
    return result;
}